

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O2

void __thiscall
amrex::BndryData::setBoundCond(BndryData *this,Orientation _face,int _n,int _comp,BoundCond *_bcn)

{
  Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
  *pVVar1;
  
  pVVar1 = LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
           ::operator[](&this->bcond,_n);
  *(int *)(*(long *)&(pVVar1->
                     super_vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                     ).
                     super__Vector_base<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[_face.val].
                     super_vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>.
                     super__Vector_base<amrex::BoundCond,_std::allocator<amrex::BoundCond>_> +
          (long)_comp * 4) = _bcn->bctype;
  return;
}

Assistant:

void
BndryData::setBoundCond (Orientation     _face,
                         int              _n,
                         int              _comp,
                         const BoundCond& _bcn) noexcept
{
    bcond[_n][_face][_comp] = _bcn;
}